

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_fe.h
# Opt level: O3

void __thiscall
lf::uscalfe::LinearFELaplaceElementMatrix::LinearFELaplaceElementMatrix
          (LinearFELaplaceElementMatrix *this)

{
  double dVar1;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *pCVar2;
  Matrix<double,_2,_1,_0,_2,_1> *pMVar3;
  undefined1 *local_50;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_48;
  Matrix<double,_2,_1,_0,_2,_1> local_28;
  
  this->_vptr_LinearFELaplaceElementMatrix = (_func_int **)&PTR_isActive_0052f3f8;
  this->kSqrt3 = 0.5773502691896258;
  this->kZeta_0 = 0.21132486540518708;
  this->kZeta_1 = 0.7886751345948129;
  (this->kQuadPoints)._M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[0] = 0.21132486540518708;
  (this->kQuadPoints)._M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[1] = 0.21132486540518708;
  (this->kQuadPoints)._M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[0] = 0.21132486540518708;
  (this->kQuadPoints)._M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[1] = 0.7886751345948129;
  (this->kQuadPoints)._M_elems[2].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[0] = 0.7886751345948129;
  (this->kQuadPoints)._M_elems[2].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[1] = 0.21132486540518708;
  (this->kQuadPoints)._M_elems[3].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[0] = 0.7886751345948129;
  (this->kQuadPoints)._M_elems[3].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[1] = 0.7886751345948129;
  local_48.m_row = 0;
  local_48.m_col = 1;
  local_48.m_currentBlockRows = 1;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       (double)&DAT_3fd5555555555555;
  local_50 = &DAT_3fd5555555555555;
  local_48.m_xpr = &local_28;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
                     (&local_48,(Scalar *)&local_50);
  pMVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished(pCVar2);
  dVar1 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
          array[1];
  (this->kTriabc).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
             .array[0];
  (this->kTriabc).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[1] = dVar1;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished(&local_48);
  local_48.m_row = 0;
  local_48.m_col = 1;
  local_48.m_currentBlockRows = 1;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       0.7;
  local_50 = (undefined1 *)0x3fd3333333333333;
  local_48.m_xpr = &local_28;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
                     (&local_48,(Scalar *)&local_50);
  pMVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished(pCVar2);
  dVar1 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
          array[1];
  (this->kQuadpt).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
             .array[0];
  (this->kQuadpt).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[1] = dVar1;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished(&local_48);
  return;
}

Assistant:

LinearFELaplaceElementMatrix() = default;